

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_comment(char_t *s,char_t endch)

{
  char_t *pcVar1;
  int iVar2;
  char in_SIL;
  byte *in_RDI;
  char_t ss;
  gap g;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  gap *in_stack_ffffffffffffffd8;
  gap *in_stack_ffffffffffffffe0;
  byte *local_10;
  
  gap::gap((gap *)&stack0xffffffffffffffd8);
  local_10 = in_RDI;
  do {
    while (bVar3 = *local_10, ((anonymous_namespace)::chartype_table[bVar3] & 0x20) != 0) {
LAB_00135a7a:
      if (*local_10 == 0xd) {
        *local_10 = 10;
        if (local_10[1] == 10) {
          gap::push(in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->end,
                    CONCAT17(bVar3,in_stack_ffffffffffffffd0));
        }
      }
      else {
        if (((*local_10 == 0x2d) && (local_10[1] == 0x2d)) &&
           ((local_10[2] == 0x3e || ((local_10[2] == 0 && (in_SIL == '>')))))) {
          pcVar1 = gap::flush(in_stack_ffffffffffffffd8,
                              (char_t *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
          *pcVar1 = '\0';
          iVar2 = 2;
          if (local_10[2] == 0x3e) {
            iVar2 = 3;
          }
          return (char_t *)(local_10 + iVar2);
        }
        if (*local_10 == 0) {
          return (char_t *)0x0;
        }
      }
      local_10 = local_10 + 1;
    }
    bVar3 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar3] & 0x20) != 0) {
      local_10 = local_10 + 1;
      goto LAB_00135a7a;
    }
    bVar3 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar3] & 0x20) != 0) {
      local_10 = local_10 + 2;
      goto LAB_00135a7a;
    }
    bVar3 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar3] & 0x20) != 0) {
      local_10 = local_10 + 3;
      goto LAB_00135a7a;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

PUGI__FN char_t* strconv_comment(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_comment));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == '-' && s[1] == '-' && PUGI__ENDSWITH(s[2], '>')) // comment ends here
			{
				*g.flush(s) = 0;

				return s + (s[2] == '>' ? 3 : 2);
			}
			else if (*s == 0)
			{
				return 0;
			}
			else ++s;
		}
	}